

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void * stbtt__hheap_alloc(stbtt__hheap *hh,size_t size,void *userdata)

{
  stbtt__hheap_chunk *psVar1;
  int local_44;
  stbtt__hheap_chunk *c;
  int count;
  void *p;
  void *userdata_local;
  size_t size_local;
  stbtt__hheap *hh_local;
  
  if (hh->first_free == (void *)0x0) {
    if (hh->num_remaining_in_head_chunk == 0) {
      if (size < 0x20) {
        local_44 = 2000;
      }
      else {
        local_44 = 100;
        if (size < 0x80) {
          local_44 = 800;
        }
      }
      psVar1 = (stbtt__hheap_chunk *)ImGui::MemAlloc(size * (long)local_44 + 8);
      if (psVar1 == (stbtt__hheap_chunk *)0x0) {
        return (void *)0x0;
      }
      psVar1->next = hh->head;
      hh->head = psVar1;
      hh->num_remaining_in_head_chunk = local_44;
    }
    hh->num_remaining_in_head_chunk = hh->num_remaining_in_head_chunk + -1;
    hh_local = (stbtt__hheap *)
               ((long)&hh->head[1].next + size * (long)hh->num_remaining_in_head_chunk);
  }
  else {
    hh_local = (stbtt__hheap *)hh->first_free;
    hh->first_free = hh_local->head;
  }
  return hh_local;
}

Assistant:

static void *stbtt__hheap_alloc(stbtt__hheap *hh, size_t size, void *userdata)
{
   if (hh->first_free) {
      void *p = hh->first_free;
      hh->first_free = * (void **) p;
      return p;
   } else {
      if (hh->num_remaining_in_head_chunk == 0) {
         int count = (size < 32 ? 2000 : size < 128 ? 800 : 100);
         stbtt__hheap_chunk *c = (stbtt__hheap_chunk *) STBTT_malloc(sizeof(stbtt__hheap_chunk) + size * count, userdata);
         if (c == NULL)
            return NULL;
         c->next = hh->head;
         hh->head = c;
         hh->num_remaining_in_head_chunk = count;
      }
      --hh->num_remaining_in_head_chunk;
      return (char *) (hh->head) + sizeof(stbtt__hheap_chunk) + size * hh->num_remaining_in_head_chunk;
   }
}